

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void reportDefault(XML_Parser parser,ENCODING *enc,char *s,char *end)

{
  XML_Convert_Result XVar1;
  OPEN_INTERNAL_ENTITY *pOVar2;
  char **ppcVar3;
  ICHAR *dataPtr;
  char *local_40;
  XML_Char *local_38;
  
  local_40 = s;
  if (enc->isUtf8 != '\0') {
    (*parser->m_defaultHandler)(parser->m_handlerArg,s,(int)end - (int)s);
    return;
  }
  if (parser->m_encoding == enc) {
    pOVar2 = (OPEN_INTERNAL_ENTITY *)&parser->m_eventPtr;
    ppcVar3 = &parser->m_eventEndPtr;
  }
  else {
    pOVar2 = parser->m_openInternalEntities;
    ppcVar3 = &pOVar2->internalEventEndPtr;
  }
  do {
    local_38 = parser->m_dataBuf;
    XVar1 = (*enc->utf8Convert)(enc,&local_40,end,&local_38,parser->m_dataBufEnd);
    *ppcVar3 = local_40;
    (*parser->m_defaultHandler)
              (parser->m_handlerArg,parser->m_dataBuf,(int)local_38 - (int)parser->m_dataBuf);
    pOVar2->internalEventPtr = local_40;
  } while (XML_CONVERT_INPUT_INCOMPLETE < XVar1);
  return;
}

Assistant:

static void
reportDefault(XML_Parser parser, const ENCODING *enc,
              const char *s, const char *end)
{
  if (MUST_CONVERT(enc, s)) {
    enum XML_Convert_Result convert_res;
    const char **eventPP;
    const char **eventEndPP;
    if (enc == encoding) {
      eventPP = &eventPtr;
      eventEndPP = &eventEndPtr;
    }
    else {
      /* To get here, two things must be true; the parser must be
       * using a character encoding that is not the same as the
       * encoding passed in, and the encoding passed in must need
       * conversion to the internal format (UTF-8 unless XML_UNICODE
       * is defined).  The only occasions on which the encoding passed
       * in is not the same as the parser's encoding are when it is
       * the internal encoding (e.g. a previously defined parameter
       * entity, already converted to internal format).  This by
       * definition doesn't need conversion, so the whole branch never
       * gets executed.
       *
       * For safety's sake we don't delete these lines and merely
       * exclude them from coverage statistics.
       *
       * LCOV_EXCL_START
       */
      eventPP = &(openInternalEntities->internalEventPtr);
      eventEndPP = &(openInternalEntities->internalEventEndPtr);
      /* LCOV_EXCL_STOP */
    }
    do {
      ICHAR *dataPtr = (ICHAR *)dataBuf;
      convert_res = XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)dataBufEnd);
      *eventEndPP = s;
      defaultHandler(handlerArg, dataBuf, (int)(dataPtr - (ICHAR *)dataBuf));
      *eventPP = s;
    } while ((convert_res != XML_CONVERT_COMPLETED) && (convert_res != XML_CONVERT_INPUT_INCOMPLETE));
  }
  else
    defaultHandler(handlerArg, (XML_Char *)s, (int)((XML_Char *)end - (XML_Char *)s));
}